

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptFunction.cpp
# Opt level: O3

bool __thiscall
Js::JavascriptFunction::GetSourceStringName(JavascriptFunction *this,JavascriptString **name)

{
  ScriptContext *this_00;
  code *pcVar1;
  bool bVar2;
  int propertyId;
  undefined4 *puVar3;
  uint extraout_var;
  PropertyString *pPVar4;
  RecyclableObject *obj;
  
  if (name == (JavascriptString **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptFunction.cpp"
                                ,0xcb7,"(name != nullptr)","name != nullptr");
    if (!bVar2) goto LAB_00bca255;
    *puVar3 = 0;
  }
  this_00 = (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr
             )->super_JavascriptLibraryBase).scriptContext.ptr;
  propertyId = (*(this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                 super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6c])(this);
  obj = (RecyclableObject *)CONCAT44(extraout_var,propertyId);
  if (obj == (RecyclableObject *)0x0) goto LAB_00bca240;
  if ((extraout_var & 0x1ffff) == 0x10000 || (extraout_var & 0xffff0000) != 0x10000) {
    if ((extraout_var & 0xffff0000) == 0x10000) goto LAB_00bca164;
    if (obj < (RecyclableObject *)0x1000000000000) {
      bVar2 = VarIsImpl<Js::JavascriptString>(obj);
      if (!bVar2) goto LAB_00bca1e3;
    }
    else {
LAB_00bca1e3:
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptFunction.cpp"
                                  ,0xcc3,"(VarIs<JavascriptString>(sourceString))",
                                  "VarIs<JavascriptString>(sourceString)");
      if (!bVar2) goto LAB_00bca255;
      *puVar3 = 0;
    }
    pPVar4 = (PropertyString *)VarTo<Js::JavascriptString>(obj);
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00bca255;
    *puVar3 = 0;
LAB_00bca164:
    if ((extraout_var & 0x1ffff) != 0x10000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar2) {
LAB_00bca255:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    pPVar4 = ScriptContext::GetPropertyString(this_00,propertyId);
  }
  *name = &pPVar4->super_JavascriptString;
LAB_00bca240:
  return obj != (RecyclableObject *)0x0;
}

Assistant:

bool JavascriptFunction::GetSourceStringName(JavascriptString** name) const
    {
        Assert(name != nullptr);
        ScriptContext* scriptContext = this->GetScriptContext();
        Var sourceString = this->GetSourceString();

        if (sourceString)
        {
            if (TaggedInt::Is(sourceString))
            {
                int32 propertyIdOfSourceString = TaggedInt::ToInt32(sourceString);
                *name = scriptContext->GetPropertyString(propertyIdOfSourceString);
                return true;
            }
            Assert(VarIs<JavascriptString>(sourceString));
            *name = VarTo<JavascriptString>(sourceString);
            return true;
        }
        return false;
    }